

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O1

bool LockDataDirectory(bool probeOnly)

{
  bool bVar1;
  LockResult LVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  char (*in_R8) [13];
  long in_FS_OFFSET;
  undefined1 local_f0 [32];
  _Alloc_hider local_d0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  bilingual_str local_90;
  path local_50;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDir((path *)&local_50,&gArgs,true);
  local_d0[0]._M_p = ".lock";
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            ((path *)&local_90,&local_d0[0]._M_p,auto_format);
  LVar2 = util::LockDirectory((path *)&local_50,(path *)&local_90,probeOnly);
  std::filesystem::__cxx11::path::~path((path *)&local_90);
  if (LVar2 == Success) {
    bVar1 = true;
    goto LAB_0017e3a5;
  }
  if (LVar2 == ErrorWrite) {
    local_d0[0]._M_p = (pointer)&local_c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,"Cannot write to data directory \'%s\'; check permissions.","");
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"Cannot write to data directory \'%s\'; check permissions.","")
      ;
    }
    else {
      local_f0._0_8_ = "Cannot write to data directory \'%s\'; check permissions.";
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                (&local_b0,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_f0);
    }
    local_f0._0_8_ = local_f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f0,local_50._M_pathname._M_dataplus._M_p,
               local_50._M_pathname._M_dataplus._M_p + local_50._M_pathname._M_string_length);
    tinyformat::format<std::__cxx11::string>
              (&local_90,(tinyformat *)local_d0,(bilingual_str *)local_f0,in_RCX);
    bVar1 = InitError(&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.translated._M_dataplus._M_p != &local_90.translated.field_2) {
      operator_delete(local_90.translated._M_dataplus._M_p,
                      local_90.translated.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.original._M_dataplus._M_p != &local_90.original.field_2) {
      operator_delete(local_90.original._M_dataplus._M_p,
                      local_90.original.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) goto LAB_0017e381;
  }
  else {
    if (LVar2 != ErrorLock) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/init.cpp"
                    ,0x443,"bool LockDataDirectory(bool)");
    }
    local_d0[0]._M_p = (pointer)&local_c0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,
               "Cannot obtain a lock on data directory %s. %s is probably already running.","");
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,
                 "Cannot obtain a lock on data directory %s. %s is probably already running.","");
    }
    else {
      local_f0._0_8_ = "Cannot obtain a lock on data directory %s. %s is probably already running.";
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                (&local_b0,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_f0);
    }
    local_f0._0_8_ = local_f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f0,local_50._M_pathname._M_dataplus._M_p,
               local_50._M_pathname._M_dataplus._M_p + local_50._M_pathname._M_string_length);
    tinyformat::format<std::__cxx11::string,char[13]>
              (&local_90,(tinyformat *)local_d0,(bilingual_str *)local_f0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Bitcoin Core",
               in_R8);
    bVar1 = InitError(&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.translated._M_dataplus._M_p != &local_90.translated.field_2) {
      operator_delete(local_90.translated._M_dataplus._M_p,
                      local_90.translated.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.original._M_dataplus._M_p != &local_90.original.field_2) {
      operator_delete(local_90.original._M_dataplus._M_p,
                      local_90.original.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
LAB_0017e381:
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0[0]._M_p != &local_c0) {
    operator_delete(local_d0[0]._M_p,local_c0._M_allocated_capacity + 1);
  }
LAB_0017e3a5:
  std::filesystem::__cxx11::path::~path(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

static bool LockDataDirectory(bool probeOnly)
{
    // Make sure only a single Bitcoin process is using the data directory.
    const fs::path& datadir = gArgs.GetDataDirNet();
    switch (util::LockDirectory(datadir, ".lock", probeOnly)) {
    case util::LockResult::ErrorWrite:
        return InitError(strprintf(_("Cannot write to data directory '%s'; check permissions."), fs::PathToString(datadir)));
    case util::LockResult::ErrorLock:
        return InitError(strprintf(_("Cannot obtain a lock on data directory %s. %s is probably already running."), fs::PathToString(datadir), PACKAGE_NAME));
    case util::LockResult::Success: return true;
    } // no default case, so the compiler can warn about missing cases
    assert(false);
}